

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O0

void testrand_bytes_test(uchar *bytes,size_t len)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  uint64_t uVar3;
  size_t in_RSI;
  void *in_RDI;
  uint32_t val;
  int now;
  size_t bits;
  int in_stack_ffffffffffffffcc;
  int local_1c;
  ulong local_18;
  
  local_18 = 0;
  memset(in_RDI,0,in_RSI);
  while (local_18 < in_RSI << 3) {
    uVar2 = testrand_bits(in_stack_ffffffffffffffcc);
    uVar3 = testrand_bits(in_stack_ffffffffffffffcc);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2 * uVar3 + 0x10;
    uVar2 = testrand_bits(in_stack_ffffffffffffffcc);
    for (local_1c = SUB164(auVar1 / ZEXT816(0x1f),0) + 1; 0 < local_1c && local_18 < in_RSI << 3;
        local_1c = local_1c + -1) {
      *(byte *)((long)in_RDI + (local_18 >> 3)) =
           *(byte *)((long)in_RDI + (local_18 >> 3)) | (byte)((int)uVar2 << ((byte)local_18 & 7));
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

static void testrand_bytes_test(unsigned char *bytes, size_t len) {
    size_t bits = 0;
    memset(bytes, 0, len);
    while (bits < len * 8) {
        int now;
        uint32_t val;
        now = 1 + (testrand_bits(6) * testrand_bits(5) + 16) / 31;
        val = testrand_bits(1);
        while (now > 0 && bits < len * 8) {
            bytes[bits / 8] |= val << (bits % 8);
            now--;
            bits++;
        }
    }
}